

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O0

void __thiscall Fl_Slider::draw(Fl_Slider *this)

{
  byte bVar1;
  int iVar2;
  Fl_Boxtype FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Fl_Slider *this_local;
  
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar1 & 0x80) != 0) {
    Fl_Widget::draw_box((Fl_Widget *)this);
  }
  iVar2 = Fl_Widget::x((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dx(FVar3);
  iVar5 = Fl_Widget::y((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar6 = Fl::box_dy(FVar3);
  iVar7 = Fl_Widget::w((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar8 = Fl::box_dw(FVar3);
  iVar9 = Fl_Widget::h((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar10 = Fl::box_dh(FVar3);
  draw(this,iVar2 + iVar4,iVar5 + iVar6,iVar7 - iVar8,iVar9 - iVar10);
  return;
}

Assistant:

void Fl_Slider::draw() {
  if (damage()&FL_DAMAGE_ALL) draw_box();
  draw(x()+Fl::box_dx(box()),
       y()+Fl::box_dy(box()),
       w()-Fl::box_dw(box()),
       h()-Fl::box_dh(box()));
}